

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter>::reject
          (AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this,
          Exception *exception)

{
  Exception *exception_00;
  ExceptionOr<int> local_1b8;
  Exception *local_18;
  Exception *exception_local;
  AdapterPromiseNode<int,_kj::UnixEventPort::ChildExitPromiseAdapter> *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = exception;
    exception_local = (Exception *)this;
    exception_00 = mv<kj::Exception>(exception);
    ExceptionOr<int>::ExceptionOr(&local_1b8,false,exception_00);
    ExceptionOr<int>::operator=(&this->result,&local_1b8);
    ExceptionOr<int>::~ExceptionOr(&local_1b8);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }